

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

int context_eq(secp256k1_context *a,secp256k1_context *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0;
  uVar3 = 0;
  if ((a->declassify == b->declassify) && ((a->ecmult_gen_ctx).built == (b->ecmult_gen_ctx).built))
  {
    iVar1 = secp256k1_scalar_eq(&(a->ecmult_gen_ctx).blind,&(b->ecmult_gen_ctx).blind);
    if (iVar1 != 0) {
      iVar1 = secp256k1_gej_eq_var(&(a->ecmult_gen_ctx).initial,&(b->ecmult_gen_ctx).initial);
      uVar2 = uVar3;
      if ((((iVar1 != 0) && ((a->illegal_callback).fn == (b->illegal_callback).fn)) &&
          ((a->illegal_callback).data == (b->illegal_callback).data)) &&
         ((a->error_callback).fn == (b->error_callback).fn)) {
        uVar2 = (uint)((a->error_callback).data == (b->error_callback).data);
      }
    }
  }
  return uVar2;
}

Assistant:

static int context_eq(const secp256k1_context *a, const secp256k1_context *b) {
    return a->declassify == b->declassify
            && ecmult_gen_context_eq(&a->ecmult_gen_ctx, &b->ecmult_gen_ctx)
            && a->illegal_callback.fn == b->illegal_callback.fn
            && a->illegal_callback.data == b->illegal_callback.data
            && a->error_callback.fn == b->error_callback.fn
            && a->error_callback.data == b->error_callback.data;
}